

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_NtkWriteSubcktFanins(FILE *pFile,Abc_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  size_t sVar5;
  int local_3c;
  int i;
  char *pName;
  int NameCounter;
  int AddedLength;
  int LineLength;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  NameCounter = 6;
  pName._4_4_ = 0;
  pAVar3 = Abc_ObjFanout0(pNode);
  pcVar4 = Abc_ObjName(pAVar3);
  strlen(pcVar4);
  uVar1 = Abc_ObjId(pNode);
  fprintf((FILE *)pFile," m%d",(ulong)uVar1);
  for (local_3c = 0; iVar2 = Abc_ObjFaninNum(pNode), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar3 = Abc_ObjFanin(pNode,local_3c);
    pcVar4 = Abc_ObjName(pAVar3);
    sVar5 = strlen(pcVar4);
    iVar2 = (int)sVar5 + 3;
    if ((pName._4_4_ != 0) && (0x4e < NameCounter + iVar2 + 3)) {
      fprintf((FILE *)pFile," \\\n");
      NameCounter = 0;
      pName._4_4_ = 0;
    }
    fprintf((FILE *)pFile," %c=%s",(ulong)(local_3c + 0x61),pcVar4);
    NameCounter = iVar2 + NameCounter;
    pName._4_4_ = pName._4_4_ + 1;
  }
  pAVar3 = Abc_ObjFanout0(pNode);
  pcVar4 = Abc_ObjName(pAVar3);
  sVar5 = strlen(pcVar4);
  if ((pName._4_4_ != 0) && (0x4b < NameCounter + (int)sVar5 + 3)) {
    fprintf((FILE *)pFile," \\\n");
  }
  fprintf((FILE *)pFile," %c=%s",0x6f,pcVar4);
  return;
}

Assistant:

void Io_NtkWriteSubcktFanins( FILE * pFile, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNet;
    int LineLength;
    int AddedLength;
    int NameCounter;
    char * pName;
    int i;

    LineLength  = 6;
    NameCounter = 0;

    // get the output name
    pName = Abc_ObjName(Abc_ObjFanout0(pNode));
    // get the line length after the output name is written
    AddedLength = strlen(pName) + 1;
    fprintf( pFile, " m%d", Abc_ObjId(pNode) );

    // get the input names
    Abc_ObjForEachFanin( pNode, pNet, i )
    {
        // get the fanin name
        pName = Abc_ObjName(pNet);
        // get the line length after the fanin name is written
        AddedLength = strlen(pName) + 3;
        if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
        { // write the line extender
            fprintf( pFile, " \\\n" );
            // reset the line length
            LineLength  = 0;
            NameCounter = 0;
        }
        fprintf( pFile, " %c=%s", 'a'+i, pName );
        LineLength += AddedLength;
        NameCounter++;
    }

    // get the output name
    pName = Abc_ObjName(Abc_ObjFanout0(pNode));
    // get the line length after the output name is written
    AddedLength = strlen(pName) + 3;
    if ( NameCounter && LineLength + AddedLength > 75 )
    { // write the line extender
        fprintf( pFile, " \\\n" );
        // reset the line length
        LineLength  = 0;
        NameCounter = 0;
    }
    fprintf( pFile, " %c=%s", 'o', pName );
}